

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_copy_to_file.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalCopyToFile *op)

{
  string *file_path;
  copy_to_execution_mode_t p_Var1;
  idx_t iVar2;
  bool bVar3;
  bool bVar4;
  CopyFunctionExecutionMode CVar5;
  reference this_00;
  type op_00;
  PhysicalOperator *pPVar6;
  FileSystem *this_01;
  PhysicalBatchCopyToFile *pPVar7;
  PhysicalCopyToFile *pPVar8;
  InvalidInputException *this_02;
  InternalException *this_03;
  string path;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&(op->super_LogicalOperator).children,0);
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(this_00);
  pPVar6 = CreatePlan(this,op_00);
  bVar3 = PreserveInsertionOrder(this->context,pPVar6);
  bVar4 = UseBatchIndex(this->context,pPVar6);
  if (op->preserve_order == PRESERVE_ORDER) {
    bVar3 = true;
  }
  else if (op->preserve_order == DONT_PRESERVE_ORDER) {
    bVar3 = false;
  }
  this_01 = FileSystem::GetFileSystem(this->context);
  file_path = &op->file_path;
  (*this_01->_vptr_FileSystem[0x17])(&path,this_01,file_path);
  ::std::__cxx11::string::operator=((string *)file_path,(string *)&path);
  ::std::__cxx11::string::~string((string *)&path);
  if (op->use_tmp_file == true) {
    StringUtil::GetFilePath(&path,file_path);
    StringUtil::GetFileName(&base,file_path);
    ::std::operator+(&local_70,"tmp_",&base);
    FileSystem::JoinPath(&local_50,this_01,&path,&local_70);
    ::std::__cxx11::string::operator=((string *)file_path,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&base);
    ::std::__cxx11::string::~string((string *)&path);
  }
  if ((((op->per_thread_output != false) || ((op->file_size_bytes).index != 0xffffffffffffffff)) ||
      (op->rotate != false)) ||
     ((op->partition_output != false ||
      ((op->partition_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (op->partition_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish)))) {
    if (op->preserve_order == PRESERVE_ORDER) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&path,"PRESERVE_ORDER is not supported with these parameters",
                 (allocator *)&base);
      InvalidInputException::InvalidInputException(this_02,&path);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar4 = false;
    bVar3 = false;
  }
  p_Var1 = (op->function).execution_mode;
  path._M_dataplus._M_p = (pointer)pPVar6;
  if (p_Var1 == (copy_to_execution_mode_t)0x0) {
    CVar5 = REGULAR_COPY_TO_FILE;
  }
  else {
    CVar5 = (*p_Var1)(bVar3,bVar4);
    if (CVar5 == BATCH_COPY_TO_FILE) {
      if (bVar4 != false) {
        pPVar6 = Make<duckdb::PhysicalBatchCopyToFile,duckdb::vector<duckdb::LogicalType,true>&,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,unsigned_long&>
                           (this,&(op->super_LogicalOperator).types,&op->function,&op->bind_data,
                            &(op->super_LogicalOperator).estimated_cardinality);
        pPVar7 = PhysicalOperator::Cast<duckdb::PhysicalBatchCopyToFile>(pPVar6);
        ::std::__cxx11::string::_M_assign((string *)&pPVar7->file_path);
        pPVar7->use_tmp_file = op->use_tmp_file;
        ::std::
        vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
        ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
                  ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                    *)&(pPVar7->super_PhysicalOperator).children,
                   (reference_wrapper<duckdb::PhysicalOperator> *)&path);
        pPVar7->return_type = op->return_type;
        pPVar7->write_empty_file = op->write_empty_file;
        return pPVar6;
      }
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&path,
                 "BATCH_COPY_TO_FILE can only be used if batch indexes are supported",
                 (allocator *)&base);
      InternalException::InternalException(this_03,&path);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pPVar6 = Make<duckdb::PhysicalCopyToFile,duckdb::vector<duckdb::LogicalType,true>&,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,unsigned_long&>
                     (this,&(op->super_LogicalOperator).types,&op->function,&op->bind_data,
                      &(op->super_LogicalOperator).estimated_cardinality);
  pPVar8 = PhysicalOperator::Cast<duckdb::PhysicalCopyToFile>(pPVar6);
  ::std::__cxx11::string::_M_assign((string *)&pPVar8->file_path);
  pPVar8->use_tmp_file = op->use_tmp_file;
  pPVar8->overwrite_mode = op->overwrite_mode;
  FilenamePattern::operator=(&pPVar8->filename_pattern,&op->filename_pattern);
  ::std::__cxx11::string::_M_assign((string *)&pPVar8->file_extension);
  pPVar8->per_thread_output = op->per_thread_output;
  iVar2 = (op->file_size_bytes).index;
  if (iVar2 != 0xffffffffffffffff) {
    (pPVar8->file_size_bytes).index = iVar2;
  }
  pPVar8->rotate = op->rotate;
  pPVar8->return_type = op->return_type;
  pPVar8->partition_output = op->partition_output;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pPVar8->partition_columns,
             &(op->partition_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  pPVar8->write_partition_columns = op->write_partition_columns;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pPVar8->names,
              &(op->names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pPVar8->expected_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &(op->expected_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pPVar8->parallel = CVar5 == PARALLEL_COPY_TO_FILE;
  pPVar8->write_empty_file = op->write_empty_file;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&(pPVar8->super_PhysicalOperator).children,
             (reference_wrapper<duckdb::PhysicalOperator> *)&path);
  return pPVar6;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalCopyToFile &op) {
	auto &plan = CreatePlan(*op.children[0]);
	bool preserve_insertion_order = PhysicalPlanGenerator::PreserveInsertionOrder(context, plan);
	bool supports_batch_index = PhysicalPlanGenerator::UseBatchIndex(context, plan);

	if (op.preserve_order == PreserveOrderType::PRESERVE_ORDER) {
		preserve_insertion_order = true;
	} else if (op.preserve_order == PreserveOrderType::DONT_PRESERVE_ORDER) {
		preserve_insertion_order = false;
	}

	auto &fs = FileSystem::GetFileSystem(context);
	op.file_path = fs.ExpandPath(op.file_path);

	if (op.use_tmp_file) {
		auto path = StringUtil::GetFilePath(op.file_path);
		auto base = StringUtil::GetFileName(op.file_path);
		op.file_path = fs.JoinPath(path, "tmp_" + base);
	}
	if (op.per_thread_output || op.file_size_bytes.IsValid() || op.rotate || op.partition_output ||
	    !op.partition_columns.empty()) {
		if (op.preserve_order == PreserveOrderType::PRESERVE_ORDER) {
			throw InvalidInputException("PRESERVE_ORDER is not supported with these parameters");
		}
		// hive-partitioning/per-thread output does not care about insertion order, and does not support batch indexes
		preserve_insertion_order = false;
		supports_batch_index = false;
	}
	auto mode = CopyFunctionExecutionMode::REGULAR_COPY_TO_FILE;
	if (op.function.execution_mode) {
		mode = op.function.execution_mode(preserve_insertion_order, supports_batch_index);
	}
	if (mode == CopyFunctionExecutionMode::BATCH_COPY_TO_FILE) {
		if (!supports_batch_index) {
			throw InternalException("BATCH_COPY_TO_FILE can only be used if batch indexes are supported");
		}
		// batched copy to file
		auto &copy =
		    Make<PhysicalBatchCopyToFile>(op.types, op.function, std::move(op.bind_data), op.estimated_cardinality);

		auto &cast_copy = copy.Cast<PhysicalBatchCopyToFile>();
		cast_copy.file_path = op.file_path;
		cast_copy.use_tmp_file = op.use_tmp_file;
		cast_copy.children.push_back(plan);
		cast_copy.return_type = op.return_type;
		cast_copy.write_empty_file = op.write_empty_file;
		return copy;
	}

	// COPY from select statement to file
	auto &copy = Make<PhysicalCopyToFile>(op.types, op.function, std::move(op.bind_data), op.estimated_cardinality);

	auto &cast_copy = copy.Cast<PhysicalCopyToFile>();
	cast_copy.file_path = op.file_path;
	cast_copy.use_tmp_file = op.use_tmp_file;
	cast_copy.overwrite_mode = op.overwrite_mode;
	cast_copy.filename_pattern = op.filename_pattern;
	cast_copy.file_extension = op.file_extension;
	cast_copy.per_thread_output = op.per_thread_output;

	if (op.file_size_bytes.IsValid()) {
		cast_copy.file_size_bytes = op.file_size_bytes;
	}

	cast_copy.rotate = op.rotate;
	cast_copy.return_type = op.return_type;
	cast_copy.partition_output = op.partition_output;
	cast_copy.partition_columns = op.partition_columns;
	cast_copy.write_partition_columns = op.write_partition_columns;
	cast_copy.names = op.names;
	cast_copy.expected_types = op.expected_types;
	cast_copy.parallel = mode == CopyFunctionExecutionMode::PARALLEL_COPY_TO_FILE;
	cast_copy.write_empty_file = op.write_empty_file;

	cast_copy.children.push_back(plan);
	return copy;
}